

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O1

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_LocaleCompare
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  Recycler *recycler;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  charcount_t cVar6;
  uint uVar7;
  undefined4 *puVar8;
  Var pvVar9;
  JavascriptString *this;
  JavascriptString *this_00;
  DynamicObject *state;
  JavascriptBoolean *pJVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  JavascriptString *pJVar11;
  LPCSTR pCVar12;
  UCollator *resource;
  undefined4 extraout_var_02;
  TempArenaAllocatorObject *tempAllocator;
  undefined4 extraout_var_03;
  char16 *pcVar13;
  undefined4 extraout_var_04;
  char16 *pcVar14;
  undefined8 uVar15;
  char16_t *form;
  Type pUVar16;
  undefined8 uVar17;
  uint in_stack_00000010;
  charcount_t local_128 [2];
  charcount_t leftNormalizedLength;
  FinalizableICUObject<UCollator_*,_&ucol_close_70> *local_80;
  Var cachedUCollator;
  charcount_t rightNormalizedLength;
  JavascriptString *local_68;
  undefined8 local_60;
  undefined1 local_58 [8];
  Arguments args;
  FinalizableICUObject<UCollator_*,_&ucol_close_70> *local_40;
  int local_38;
  byte local_32;
  byte local_31;
  UErrorCode status;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x728,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00b671a9;
    *puVar8 = 0;
  }
  args.Info = (Type)&stack0x00000018;
  local_58 = (undefined1  [8])callInfo;
  if ((callInfo._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x728,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) goto LAB_00b671a9;
    *puVar8 = 0;
  }
  args.Values = (Type)(((((function->type).ptr)->javascriptLibrary).ptr)->
                      super_JavascriptLibraryBase).scriptContext.ptr;
  if (((ulong)local_58 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x728,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar2) goto LAB_00b671a9;
    *puVar8 = 0;
  }
  if ((local_58._0_4_ & 0xffffff) == 5) {
    pvVar9 = Arguments::operator[]((Arguments *)local_58,1);
    bVar2 = VarIs<Js::JavascriptString>(pvVar9);
    if (!bVar2) goto LAB_00b66ace;
    pvVar9 = Arguments::operator[]((Arguments *)local_58,2);
    bVar2 = VarIs<Js::JavascriptString>(pvVar9);
    if (!bVar2) goto LAB_00b66ace;
    pvVar9 = Arguments::operator[]((Arguments *)local_58,3);
    bVar2 = DynamicObject::IsBaseDynamicObject(pvVar9);
    if (!bVar2) goto LAB_00b66ace;
    pvVar9 = Arguments::operator[]((Arguments *)local_58,4);
    bVar2 = VarIs<Js::JavascriptBoolean>(pvVar9);
    if (!bVar2) goto LAB_00b66ace;
  }
  else {
LAB_00b66ace:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x72f,
                                "((args.Info.Count == 5 && VarIs<JavascriptString>(args[1]) && VarIs<JavascriptString>(args[2]) && DynamicObject::IsBaseDynamicObject(args[3]) && VarIs<JavascriptBoolean>(args[4])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar2) goto LAB_00b671a9;
    *puVar8 = 0;
  }
  pvVar9 = Arguments::operator[]((Arguments *)local_58,1);
  this = UnsafeVarTo<Js::JavascriptString>(pvVar9);
  pvVar9 = Arguments::operator[]((Arguments *)local_58,2);
  this_00 = UnsafeVarTo<Js::JavascriptString>(pvVar9);
  pvVar9 = Arguments::operator[]((Arguments *)local_58,3);
  state = UnsafeVarTo<Js::DynamicObject>(pvVar9);
  pvVar9 = Arguments::operator[]((Arguments *)local_58,4);
  pJVar10 = UnsafeVarTo<Js::JavascriptBoolean>(pvVar9);
  form = L"%S(): Calling \'%s\'.localeCompare(\'%s\', ...)\n";
  if (pJVar10->value == 0) {
    form = L"%S(): Calling Collator.prototype.compare(\'%s\', \'%s\')\n";
  }
  iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(this);
  iVar4 = (*(this_00->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(this_00);
  Output::Trace(IntlPhase,form,"EntryIntl_LocaleCompare",CONCAT44(extraout_var,iVar3),
                CONCAT44(extraout_var_00,iVar4));
  local_80 = (FinalizableICUObject<UCollator_*,_&ucol_close_70> *)0x0;
  local_38 = 0;
  iVar3 = (*(state->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x14])(state,state,9,&local_80,0,args.Values);
  if (iVar3 != 0) {
    local_40 = local_80;
    Output::Trace(IntlPhase,L"%S(): Using previously cached UCollator (0x%x)\n",
                  "EntryIntl_LocaleCompare");
    goto LAB_00b67088;
  }
  local_68 = AssertStringProperty(state,(PropertyIds)0x20d);
  uVar7 = AssertIntegerProperty(state,(PropertyIds)0x253);
  if (3 < uVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x19d,"(p >= 0 && ret < T::Max)","Invalid value for enum property")
    ;
    if (!bVar2) goto LAB_00b671a9;
    *puVar8 = 0;
  }
  local_32 = AssertBooleanProperty(state,(PropertyIds)0x250);
  local_31 = AssertBooleanProperty(state,(PropertyIds)0x251);
  uVar5 = AssertIntegerProperty(state,(PropertyIds)0x254);
  local_60 = CONCAT44(extraout_var_01,uVar5);
  if (2 < uVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x19d,"(p >= 0 && ret < T::Max)","Invalid value for enum property")
    ;
    if (!bVar2) goto LAB_00b671a9;
    *puVar8 = 0;
  }
  pJVar11 = AssertStringProperty(state,(PropertyIds)0x255);
  memset((char (*) [157])local_128,0,0x9d);
  LangtagToLocaleID<157ul>(local_68,(char (*) [157])local_128);
  _rightNormalizedLength = 0x680063;
  cachedUCollator._0_4_ = 0x650073;
  cachedUCollator._4_2_ = 0x61;
  cachedUCollator._6_2_ = 0x72;
  iVar3 = (*(pJVar11->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x6b])(pJVar11,&cachedUCollator,6);
  if (iVar3 != 0) {
    uloc_setKeywordValue_70("collation","search",local_128,0x9d,&local_38);
    if (local_38 == 7) goto LAB_00b671ab;
    if (0 < local_38 || local_38 == -0x7c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      pCVar12 = (LPCSTR)u_errorName_70(local_38);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x75b,"(false)",pCVar12);
      if (!bVar2) goto LAB_00b671a9;
      *puVar8 = 0;
    }
  }
  recycler = (Recycler *)args.Values[0x240];
  resource = (UCollator *)ucol_open_70(local_128,&local_38);
  local_40 = FinalizableICUObject<UCollator_*,_&ucol_close_70>::New(recycler,resource);
  if (local_38 == 7) goto LAB_00b671ab;
  if (0 < local_38 || local_38 == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    pCVar12 = (LPCSTR)u_errorName_70(local_38);
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x75f,"(false)",pCVar12);
    if (!bVar2) goto LAB_00b671a9;
    *puVar8 = 0;
  }
  uVar17 = local_60;
  switch(uVar7) {
  case 0:
    pUVar16 = local_40->resource;
    uVar15 = 0;
    break;
  case 1:
    pUVar16 = local_40->resource;
    uVar15 = 1;
    break;
  case 2:
    ucol_setStrength_70(local_40->resource,0);
    ucol_setAttribute_70(local_40->resource,3,0x11,&local_38);
    goto switchD_00b66efa_default;
  case 3:
    pUVar16 = local_40->resource;
    uVar15 = 2;
    break;
  default:
    goto switchD_00b66efa_default;
  }
  ucol_setStrength_70(pUVar16,uVar15);
switchD_00b66efa_default:
  if (local_32 != 0) {
    ucol_setAttribute_70(local_40->resource,1,0x14,&local_38);
  }
  if (local_31 != 0) {
    ucol_setAttribute_70(local_40->resource,7,0x11,&local_38);
  }
  iVar3 = (int)uVar17;
  if (iVar3 == 0) {
    uVar15 = 0x19;
LAB_00b66f92:
    ucol_setAttribute_70(local_40->resource,2,uVar15,&local_38);
  }
  else if (iVar3 == 1) {
    uVar15 = 0x18;
    goto LAB_00b66f92;
  }
  if (local_38 == 7) {
LAB_00b671ab:
    Throw::OutOfMemory();
  }
  if (0 < local_38 || local_38 == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    pCVar12 = (LPCSTR)u_errorName_70(local_38);
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x78b,"(false)",pCVar12);
    if (!bVar2) {
LAB_00b671a9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar8 = 0;
    uVar17 = local_60;
  }
  iVar3 = (*(local_68->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])();
  Output::Trace(IntlPhase,
                L"%S(): Caching UCollator (0x%x) with langtag = %s, sensitivity = %d, caseFirst = %d, ignorePunctuation = %d, and numeric = %d\n"
                ,"EntryIntl_LocaleCompare",local_40,CONCAT44(extraout_var_02,iVar3),uVar7,uVar17,
                (ulong)local_32,(ulong)local_31);
  (*(state->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x19])(state,9,local_40,0,0);
LAB_00b67088:
  tempAllocator =
       ScriptContext::GetTemporaryAllocator((ScriptContext *)args.Values,L"EntryIntl_LocaleCompare")
  ;
  local_128[0] = 0;
  iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(this);
  cVar6 = JavascriptString::GetLength(this);
  bVar2 = PlatformAgnostic::UnicodeText::IsNormalizedString
                    (C,(char16 *)CONCAT44(extraout_var_03,iVar3),cVar6);
  if (bVar2) {
    uVar7 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])(this);
    pcVar13 = (char16 *)(ulong)uVar7;
    local_128[0] = JavascriptString::GetLength(this);
  }
  else {
    pcVar13 = JavascriptString::GetNormalizedString(this,C,&tempAllocator->allocator,local_128);
  }
  cachedUCollator._0_4_ = 0;
  iVar3 = (*(this_00->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(this_00);
  cVar6 = JavascriptString::GetLength(this_00);
  bVar2 = PlatformAgnostic::UnicodeText::IsNormalizedString
                    (C,(char16 *)CONCAT44(extraout_var_04,iVar3),cVar6);
  if (bVar2) {
    uVar7 = (*(this_00->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x65])(this_00);
    pcVar14 = (char16 *)(ulong)uVar7;
    cachedUCollator._0_4_ = JavascriptString::GetLength(this_00);
  }
  else {
    pcVar14 = JavascriptString::GetNormalizedString
                        (this_00,C,&tempAllocator->allocator,(charcount_t *)&cachedUCollator);
  }
  uVar7 = ucol_strcoll_70(local_40->resource,pcVar13,local_128[0],pcVar14,
                          (charcount_t)cachedUCollator);
  ScriptContext::ReleaseTemporaryAllocator((ScriptContext *)args.Values,tempAllocator);
  return (Var)((ulong)uVar7 | 0x1000000000000);
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_LocaleCompare(RecyclableObject* function, CallInfo callInfo, ...)
    {
#ifdef INTL_WINGLOB
        AssertOrFailFastMsg(false, "platform.localeCompare should not be called in Intl-WinGlob");
        return nullptr;
#else
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(
            args.Info.Count == 5 &&
            VarIs<JavascriptString>(args[1]) &&
            VarIs<JavascriptString>(args[2]) &&
            DynamicObject::IsBaseDynamicObject(args[3]) &&
            VarIs<JavascriptBoolean>(args[4])
        );

        JavascriptString *left = UnsafeVarTo<JavascriptString>(args[1]);
        JavascriptString *right = UnsafeVarTo<JavascriptString>(args[2]);
        DynamicObject *state = UnsafeVarTo<DynamicObject>(args[3]);
        bool forStringPrototypeLocaleCompare = UnsafeVarTo<JavascriptBoolean>(args[4])->GetValue();
        if (forStringPrototypeLocaleCompare)
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(String_Prototype_localeCompare);
            INTL_TRACE("Calling '%s'.localeCompare('%s', ...)", left->GetSz(), right->GetSz());
        }
        else
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Collator_Prototype_compare);
            INTL_TRACE("Calling Collator.prototype.compare('%s', '%s')", left->GetSz(), right->GetSz());
        }

        // Below, we lazy-initialize the backing UCollator on the first call to localeCompare
        // On subsequent calls, the UCollator will be cached in state.CachedUCollator
        Var cachedUCollator = nullptr;
        FinalizableUCollator *coll = nullptr;
        UErrorCode status = U_ZERO_ERROR;
        if (state->GetInternalProperty(state, InternalPropertyIds::CachedUCollator, &cachedUCollator, nullptr, scriptContext))
        {
            coll = reinterpret_cast<FinalizableUCollator *>(cachedUCollator);
            INTL_TRACE("Using previously cached UCollator (0x%x)", coll);
        }
        else
        {
            // the object key is locale according to Intl spec, but its more accurately a BCP47 Language Tag, not an ICU LocaleID
            JavascriptString *langtag = AssertStringProperty(state, PropertyIds::locale);
            CollatorSensitivity sensitivity = AssertEnumProperty<CollatorSensitivity>(state, PropertyIds::sensitivityEnum);
            bool ignorePunctuation = AssertBooleanProperty(state, PropertyIds::ignorePunctuation);
            bool numeric = AssertBooleanProperty(state, PropertyIds::numeric);
            CollatorCaseFirst caseFirst = AssertEnumProperty<CollatorCaseFirst>(state, PropertyIds::caseFirstEnum);
            JavascriptString *usage = AssertStringProperty(state, PropertyIds::usage);

            char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
            LangtagToLocaleID(langtag, localeID);

            const char16 searchString[] = _u("search");
            if (usage->BufferEquals(searchString, _countof(searchString) - 1)) // minus the null terminator
            {
                uloc_setKeywordValue("collation", "search", localeID, _countof(localeID), &status);
                ICU_ASSERT(status, true);
            }

            coll = FinalizableUCollator::New(scriptContext->GetRecycler(), ucol_open(localeID, &status));
            ICU_ASSERT(status, true);

            // REVIEW(jahorto): Anything that requires a status will no-op if its in a failure state
            // Thus, we can ICU_ASSERT the status once after all of the properties are set for simplicity
            if (sensitivity == CollatorSensitivity::Base)
            {
                ucol_setStrength(*coll, UCOL_PRIMARY);
            }
            else if (sensitivity == CollatorSensitivity::Accent)
            {
                ucol_setStrength(*coll, UCOL_SECONDARY);
            }
            else if (sensitivity == CollatorSensitivity::Case)
            {
                // see "description" for the caseLevel default option: http://userguide.icu-project.org/collation/customization
                ucol_setStrength(*coll, UCOL_PRIMARY);
                ucol_setAttribute(*coll, UCOL_CASE_LEVEL, UCOL_ON, &status);
            }
            else if (sensitivity == CollatorSensitivity::Variant)
            {
                ucol_setStrength(*coll, UCOL_TERTIARY);
            }

            if (ignorePunctuation)
            {
                // see http://userguide.icu-project.org/collation/customization/ignorepunct
                ucol_setAttribute(*coll, UCOL_ALTERNATE_HANDLING, UCOL_SHIFTED, &status);
            }

            if (numeric)
            {
                ucol_setAttribute(*coll, UCOL_NUMERIC_COLLATION, UCOL_ON, &status);
            }

            if (caseFirst == CollatorCaseFirst::Upper)
            {
                ucol_setAttribute(*coll, UCOL_CASE_FIRST, UCOL_UPPER_FIRST, &status);
            }
            else if (caseFirst == CollatorCaseFirst::Lower)
            {
                ucol_setAttribute(*coll, UCOL_CASE_FIRST, UCOL_LOWER_FIRST, &status);
            }

            // Ensure that collator configuration was successfull
            ICU_ASSERT(status, true);

            INTL_TRACE(
                "Caching UCollator (0x%x) with langtag = %s, sensitivity = %d, caseFirst = %d, ignorePunctuation = %d, and numeric = %d",
                coll,
                langtag->GetSz(),
                sensitivity,
                caseFirst,
                ignorePunctuation,
                numeric
            );

            // cache coll for later use (so that the condition that brought us here returns true for future calls)
            state->SetInternalProperty(
                InternalPropertyIds::CachedUCollator,
                coll,
                PropertyOperationFlags::PropertyOperation_None,
                nullptr
            );
        }

        // As of ES2015, String.prototype.localeCompare must compare canonically equivalent strings as equal
        BEGIN_TEMP_ALLOCATOR(tempAllocator, scriptContext, _u("EntryIntl_LocaleCompare"));

        const char16 *leftNormalized = nullptr;
        charcount_t leftNormalizedLength = 0;
        if (UnicodeText::IsNormalizedString(UnicodeText::NormalizationForm::C, left->GetSz(), left->GetLength()))
        {
            leftNormalized = left->GetSz();
            leftNormalizedLength = left ->GetLength();
        }
        else
        {
            leftNormalized = left->GetNormalizedString(UnicodeText::NormalizationForm::C, tempAllocator, leftNormalizedLength);
        }

        const char16 *rightNormalized = nullptr;
        charcount_t rightNormalizedLength = 0;
        if (UnicodeText::IsNormalizedString(UnicodeText::NormalizationForm::C, right->GetSz(), right->GetLength()))
        {
            rightNormalized = right->GetSz();
            rightNormalizedLength = right->GetLength();
        }
        else
        {
            rightNormalized = right->GetNormalizedString(UnicodeText::NormalizationForm::C, tempAllocator, rightNormalizedLength);
        }

        static_assert(UCOL_LESS == -1 && UCOL_EQUAL == 0 && UCOL_GREATER == 1, "ucol_strcoll should return values compatible with localeCompare");
        Var ret = JavascriptNumber::ToVar(ucol_strcoll(
            *coll,
            reinterpret_cast<const UChar *>(leftNormalized),
            leftNormalizedLength,
            reinterpret_cast<const UChar *>(rightNormalized),
            rightNormalizedLength
        ), scriptContext);

        END_TEMP_ALLOCATOR(tempAllocator, scriptContext);

        return ret;
#endif
    }